

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_false>::change_branch_(DaTrie<true,_false,_false> *this,Query *query)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  byte *pbVar7;
  DaTrie<true,_false,_false> *this_00;
  uint8_t *puVar8;
  reference pvVar9;
  Query *in_RSI;
  ulong __n;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  size_t i_1;
  size_t i;
  uint32_t parent_pos;
  size_t num_regress;
  uint32_t value;
  uint32_t child_pos;
  Edge edge;
  undefined4 in_stack_fffffffffffffe48;
  uint32_t in_stack_fffffffffffffe4c;
  Query *in_stack_fffffffffffffe50;
  value_type_conflict *in_stack_fffffffffffffe58;
  vector<char,_std::allocator<char>_> *this_01;
  Edge *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  DaTrie<true,_false,_false> *in_stack_fffffffffffffe70;
  DaTrie<true,_false,_false> *in_stack_fffffffffffffe78;
  DaTrie<true,_false,_false> *in_stack_fffffffffffffe80;
  ulong local_158;
  ulong local_150;
  long local_140;
  uint local_124;
  Edge local_118;
  Query *local_10;
  
  local_10 = in_RSI;
  uVar3 = Query::node_pos(in_RSI);
  sVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI);
  if (sVar4 <= uVar3) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x242,
                  "void ddd::DaTrie<true, false, false>::change_branch_(Query &) [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  uVar3 = Query::node_pos(local_10);
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
  bVar2 = Bc::is_fixed(pvVar5);
  if (!bVar2) {
    __assert_fail("bc_[query.node_pos()].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x243,
                  "void ddd::DaTrie<true, false, false>::change_branch_(Query &) [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  Edge::Edge(&local_118);
  Query::node_pos(local_10);
  edge_(in_stack_fffffffffffffe70,(uint32_t)(in_stack_fffffffffffffe68 >> 0x20),
        in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  sVar6 = Edge::size(&local_118);
  if (sVar6 == 1) {
    uVar3 = Query::node_pos(local_10);
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    uVar3 = Bc::base(pvVar5);
    pbVar7 = Edge::begin(&local_118);
    bVar1 = *pbVar7;
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       (in_RDI,(ulong)(uVar3 ^ bVar1));
    bVar2 = Bc::is_leaf(pvVar5);
    if (bVar2) {
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         (in_RDI,(ulong)(uVar3 ^ bVar1));
      local_124 = Bc::value(pvVar5);
      unfix_(in_stack_fffffffffffffe80,(uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe70);
      local_140 = 0;
      while (uVar3 = Query::node_pos(local_10), uVar3 != 0) {
        uVar3 = Query::node_pos(local_10);
        pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
        Bc::check(pvVar5);
        this_00 = (DaTrie<true,_false,_false> *)
                  edge_size_(in_stack_fffffffffffffe78,
                             (uint32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                             in_stack_fffffffffffffe68);
        if (this_00 != (DaTrie<true,_false,_false> *)0x1) break;
        Query::node_pos(local_10);
        unfix_(this_00,(uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe70)
        ;
        Query::prev(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        local_140 = local_140 + 1;
      }
      uVar3 = Query::node_pos(local_10);
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
      uVar3 = tail_size((DaTrie<true,_false,_false> *)0x171317);
      Bc::set_value(pvVar5,uVar3);
      while (local_140 != 0) {
        Query::key(local_10);
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe58);
        Query::next(local_10);
        local_140 = local_140 + -1;
      }
      Edge::begin(&local_118);
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe50,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      puVar8 = Edge::begin(&local_118);
      if (*puVar8 == '\0') {
        for (local_158 = 0; local_158 < 4; local_158 = local_158 + 1) {
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe50,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
      }
      else {
        while (pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),
                                   (ulong)local_124), *pvVar9 != '\0') {
          in_stack_fffffffffffffe60 = (Edge *)(in_RDI + 1);
          __n = (ulong)local_124;
          local_124 = local_124 + 1;
          std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,__n);
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58);
          *(int *)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_finish =
               *(int *)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
        }
        this_01 = (vector<char,_std::allocator<char>_> *)(in_RDI + 1);
        std::vector<char,_std::allocator<char>_>::operator[](this_01,(ulong)local_124);
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,
                   (value_type_conflict *)this_01);
        *(int *)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_finish =
             *(int *)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        for (local_150 = 0; local_124 = local_124 + 1, local_150 < 4; local_150 = local_150 + 1) {
          std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),(ulong)local_124);
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,
                     (value_type_conflict *)this_01);
          *(int *)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_finish =
               *(int *)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
        }
      }
    }
  }
  Edge::~Edge(&local_118);
  return;
}

Assistant:

void change_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edge;
    edge_(query.node_pos(), edge, 2);

    if (edge.size() != 1) {
      return;
    }

    auto child_pos = bc_[query.node_pos()].base() ^*edge.begin();
    if (!bc_[child_pos].is_leaf()) {
      return;
    }

    auto value = bc_[child_pos].value();
    unfix_(child_pos, blocks_);

    size_t num_regress = 0;
    while (query.node_pos() != ROOT_POS) {
      auto parent_pos = bc_[query.node_pos()].check();
      if (edge_size_(parent_pos, 2) != 1) {
        break;
      }
      if (WithNLM) {
        delete_sib_(query.node_pos());
      }
      unfix_(query.node_pos(), blocks_);
      query.prev(parent_pos);
      ++num_regress;
    }

    bc_[query.node_pos()].set_value(tail_size());
    while (0 < num_regress--) {
      tail_.push_back(*query.key());
      query.next();
    }
    tail_.push_back(*edge.begin());

    if (*edge.begin() != '\0') {
      while (tail_[value] != '\0') {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
      tail_.push_back(tail_[value++]);
      ++tail_emps_;
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
    } else {
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(static_cast<uint8_t>(value & 0xFF));
        value >>= 8;
      }
    }
  }